

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O2

DecodeStatus DecodeCrosspathX2(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  cs_detail *pcVar1;
  DecodeStatus DVar2;
  uint uVar3;
  
  pcVar1 = Inst->flat_insn->detail;
  DVar2 = MCDisassembler_Success;
  if (pcVar1 != (cs_detail *)0x0) {
    if (Val == 1) {
      (pcVar1->field_6).x86.operands[4].field_1.mem.base = X86_REG_AH;
      if (Inst->Operands[1].Kind == '\x01') {
        uVar3 = Inst->Operands[1].field_2.RegVal;
        if (uVar3 - 0x19 < 0x20) {
          uVar3 = uVar3 + 0x20;
        }
        else {
          if (0x1f < uVar3 - 0x39) {
            return MCDisassembler_Success;
          }
          uVar3 = uVar3 - 0x20;
        }
        Inst->Operands[1].field_2.RegVal = uVar3;
        return DVar2;
      }
    }
    else {
      if (Val == 0) {
        (pcVar1->field_6).x86.operands[4].field_1.mem.base = X86_REG_INVALID;
        return DVar2;
      }
      (pcVar1->field_6).x86.operands[4].field_1.mem.base = ~X86_REG_INVALID;
      DVar2 = MCDisassembler_Fail;
    }
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeCrosspathX2(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	DecodeStatus ret = MCDisassembler_Success;
	MCOperand *op;

	if(!Inst->flat_insn->detail)
		return MCDisassembler_Success;

	switch(Val) {
		case 0:
			Inst->flat_insn->detail->tms320c64x.funit.crosspath = 0;
			break;
		case 1:
			Inst->flat_insn->detail->tms320c64x.funit.crosspath = 1;
			op = &Inst->Operands[1];
			if(op->Kind == kRegister) {
				if((op->RegVal >= TMS320C64X_REG_A0) && (op->RegVal <= TMS320C64X_REG_A31))
					op->RegVal = (op->RegVal - TMS320C64X_REG_A0 + TMS320C64X_REG_B0);
				else if((op->RegVal >= TMS320C64X_REG_B0) && (op->RegVal <= TMS320C64X_REG_B31))
					op->RegVal = (op->RegVal - TMS320C64X_REG_B0 + TMS320C64X_REG_A0);
			}
			break;
		default:
			Inst->flat_insn->detail->tms320c64x.funit.crosspath = -1;
			ret = MCDisassembler_Fail;
			break;
	}

	return ret;
}